

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O2

Gia_Man_t * Bmc_CexPerformUnrolling(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  uint uVar1;
  int iLit0;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  int iVar7;
  
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                  ,0x8f,"Gia_Man_t *Bmc_CexPerformUnrolling(Gia_Man_t *, Abc_Cex_t *)");
  }
  p_00 = Gia_ManStart((pCex->iFrame + 1) * p->nObjs);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p->pObjs->Value = 0;
  for (iVar6 = 0; iVar6 < p->nRegs; iVar6 = iVar6 + 1) {
    pGVar3 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar6);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    pGVar3->Value = 0;
  }
  Gia_ManHashAlloc(p_00);
  iVar6 = 0;
  do {
    if (pCex->iFrame < iVar6) {
      Gia_ManHashStop(p_00);
      pGVar3 = Gia_ManPo(p,pCex->iPo);
      Gia_ManAppendCo(p_00,pGVar3->Value);
      pGVar5 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar5;
    }
    for (iVar7 = 0; iVar7 < p->vCis->nSize - p->nRegs; iVar7 = iVar7 + 1) {
      pGVar3 = Gia_ManCi(p,iVar7);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar1 = Gia_ManAppendCi(p_00);
      pGVar3->Value = uVar1;
    }
    for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
      pGVar3 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar7);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar7);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar4->Value = pGVar3->Value;
    }
    for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
      pGVar3 = Gia_ManObj(p,iVar7);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
        iLit0 = Gia_ObjFanin0Copy(pGVar3);
        uVar1 = (uint)((ulong)*(undefined8 *)pGVar3 >> 0x20);
        iLit1 = Abc_LitNotCond(pGVar3[-(ulong)(uVar1 & 0x1fffffff)].Value,uVar1 >> 0x1d & 1);
        uVar1 = Gia_ManHashAnd(p_00,iLit0,iLit1);
        pGVar3->Value = uVar1;
      }
    }
    for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
      pGVar3 = Gia_ManCo(p,iVar7);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar1 = Gia_ObjFanin0Copy(pGVar3);
      pGVar3->Value = uVar1;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Bmc_CexPerformUnrolling( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k;
    assert( Gia_ManRegNum(p) > 0 );
    pNew = Gia_ManStart( (pCex->iFrame + 1) * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachRi( p, pObj, k )
        pObj->Value = 0;
    Gia_ManHashAlloc( pNew );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->Value = pObjRi->Value;
        Gia_ManForEachAnd( p, pObj, k )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, k )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
    }
    Gia_ManHashStop( pNew );
    pObj = Gia_ManPo(p, pCex->iPo);
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}